

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction_base.cpp
# Opt level: O2

Script * cfd::api::SetP2shMultisigUnlockingScript
                   (Script *__return_storage_ptr__,
                   vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *signature_data
                   ,Script *redeem_script)

{
  pointer pBVar1;
  ByteData *signature;
  pointer data;
  ScriptBuilder sb;
  ScriptBuilder local_48;
  
  local_48._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00647848;
  local_48.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  core::ScriptBuilder::AppendOperator(&local_48,(ScriptOperator *)core::ScriptOperator::OP_0);
  pBVar1 = (signature_data->
           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (data = (signature_data->
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl
              .super__Vector_impl_data._M_start; data != pBVar1; data = data + 1) {
    core::ScriptBuilder::AppendData(&local_48,data);
  }
  core::ScriptBuilder::AppendData(&local_48,redeem_script);
  core::ScriptBuilder::Build(__return_storage_ptr__,&local_48);
  core::ScriptBuilder::~ScriptBuilder(&local_48);
  return __return_storage_ptr__;
}

Assistant:

static Script SetP2shMultisigUnlockingScript(
    const std::vector<ByteData>& signature_data, const Script& redeem_script) {
  ScriptBuilder sb;
  sb.AppendOperator(ScriptOperator::OP_0);
  for (const ByteData& signature : signature_data) {
    sb.AppendData(signature);
  }
  sb.AppendData(redeem_script);
  return sb.Build();
}